

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterLoadRowid(Fts5Index *p,Fts5SegIter *pIter)

{
  byte bVar1;
  Fts5Data *pFVar2;
  long lVar3;
  
  pFVar2 = pIter->pLeaf;
  lVar3 = pIter->iLeafOffset;
  if (pFVar2->szLeaf <= lVar3) {
    do {
      fts5SegIterNextPage(p,pIter);
      pFVar2 = pIter->pLeaf;
      if (pFVar2 == (Fts5Data *)0x0) {
        if (p->rc != 0) {
          return;
        }
        p->rc = 0x10b;
        return;
      }
    } while (pIter->pLeaf->szLeaf < 5);
    lVar3 = 4;
  }
  bVar1 = sqlite3Fts5GetVarint(pFVar2->p + lVar3,(u64 *)&pIter->iRowid);
  pIter->iLeafOffset = (ulong)bVar1 + lVar3;
  return;
}

Assistant:

static void fts5SegIterLoadRowid(Fts5Index *p, Fts5SegIter *pIter){
  u8 *a = pIter->pLeaf->p;        /* Buffer to read data from */
  i64 iOff = pIter->iLeafOffset;

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( iOff>=pIter->pLeaf->szLeaf ){
    fts5SegIterNextPage(p, pIter);
    if( pIter->pLeaf==0 ){
      if( p->rc==SQLITE_OK ) p->rc = FTS5_CORRUPT;
      return;
    }
    iOff = 4;
    a = pIter->pLeaf->p;
  }
  iOff += sqlite3Fts5GetVarint(&a[iOff], (u64*)&pIter->iRowid);
  pIter->iLeafOffset = iOff;
}